

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pillar.cpp
# Opt level: O0

void __thiscall
DPillar::DPillar(DPillar *this,sector_t *sector,EPillar type,double speed,double floordist,
                double ceilingdist,int crush,bool hexencrush)

{
  vertex_t *pvVar1;
  sector_t *sec;
  bool bVar2;
  DSectorEffect *q;
  DInterpolation *pDVar3;
  double dVar4;
  double dVar5;
  FName local_60 [4];
  vertex_t *local_50;
  vertex_t *spot;
  double newheight;
  bool hexencrush_local;
  double dStack_38;
  int crush_local;
  double ceilingdist_local;
  double floordist_local;
  double speed_local;
  sector_t *psStack_18;
  EPillar type_local;
  sector_t *sector_local;
  DPillar *this_local;
  
  newheight._3_1_ = hexencrush;
  newheight._4_4_ = crush;
  dStack_38 = ceilingdist;
  ceilingdist_local = floordist;
  floordist_local = speed;
  speed_local._4_4_ = type;
  psStack_18 = sector;
  sector_local = (sector_t *)this;
  DMover::DMover(&this->super_DMover,sector);
  (this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00b6d5c8;
  TObjPtr<DInterpolation>::TObjPtr(&this->m_Interp_Ceiling);
  TObjPtr<DInterpolation>::TObjPtr(&this->m_Interp_Floor);
  q = TObjPtr<DSectorEffect>::operator=(&psStack_18->ceilingdata,(DSectorEffect *)this);
  TObjPtr<DSectorEffect>::operator=(&psStack_18->floordata,q);
  pDVar3 = sector_t::SetInterpolation(psStack_18,1,true);
  TObjPtr<DInterpolation>::operator=(&this->m_Interp_Floor,pDVar3);
  pDVar3 = sector_t::SetInterpolation(psStack_18,0,true);
  TObjPtr<DInterpolation>::operator=(&this->m_Interp_Ceiling,pDVar3);
  this->m_Type = speed_local._4_4_;
  this->m_Crush = newheight._4_4_;
  this->m_Hexencrush = (bool)(newheight._3_1_ & 1);
  if (speed_local._4_4_ == pillarBuild) {
    if ((ceilingdist_local != 0.0) || (NAN(ceilingdist_local))) {
      dVar4 = sector_t::CenterFloor(psStack_18);
      spot = (vertex_t *)(dVar4 + ceilingdist_local);
      dVar4 = secplane_t::PointToDist(&psStack_18->floorplane,&psStack_18->centerspot,(double)spot);
      this->m_FloorTarget = dVar4;
      dVar4 = secplane_t::PointToDist
                        (&psStack_18->ceilingplane,&psStack_18->centerspot,(double)spot);
      this->m_CeilingTarget = dVar4;
    }
    else {
      dVar4 = sector_t::CenterFloor(psStack_18);
      dVar5 = sector_t::CenterCeiling(psStack_18);
      spot = (vertex_t *)((dVar4 + dVar5) * 0.5);
      dVar4 = secplane_t::PointToDist(&psStack_18->floorplane,&psStack_18->centerspot,(double)spot);
      this->m_FloorTarget = dVar4;
      dVar4 = secplane_t::PointToDist
                        (&psStack_18->ceilingplane,&psStack_18->centerspot,(double)spot);
      pvVar1 = spot;
      this->m_CeilingTarget = dVar4;
      dVar4 = sector_t::CenterFloor(psStack_18);
      ceilingdist_local = (double)pvVar1 - dVar4;
    }
    dStack_38 = sector_t::CenterCeiling(psStack_18);
    dStack_38 = dStack_38 - (double)spot;
  }
  else {
    if ((ceilingdist_local != 0.0) || (NAN(ceilingdist_local))) {
      dVar4 = sector_t::CenterFloor(psStack_18);
      spot = (vertex_t *)(dVar4 - ceilingdist_local);
      dVar4 = secplane_t::PointToDist(&psStack_18->floorplane,&psStack_18->centerspot,(double)spot);
      this->m_FloorTarget = dVar4;
    }
    else {
      spot = (vertex_t *)sector_t::FindLowestFloorSurrounding(psStack_18,&local_50);
      dVar4 = secplane_t::PointToDist(&psStack_18->floorplane,local_50,(double)spot);
      this->m_FloorTarget = dVar4;
      dVar4 = secplane_t::ZatPoint(&psStack_18->floorplane,local_50);
      ceilingdist_local = dVar4 - (double)spot;
    }
    if ((dStack_38 != 0.0) || (NAN(dStack_38))) {
      dVar4 = sector_t::CenterCeiling(psStack_18);
      spot = (vertex_t *)(dVar4 + dStack_38);
      dVar4 = secplane_t::PointToDist
                        (&psStack_18->ceilingplane,&psStack_18->centerspot,(double)spot);
      this->m_CeilingTarget = dVar4;
    }
    else {
      spot = (vertex_t *)sector_t::FindHighestCeilingSurrounding(psStack_18,&local_50);
      dVar4 = secplane_t::PointToDist(&psStack_18->ceilingplane,local_50,(double)spot);
      pvVar1 = spot;
      this->m_CeilingTarget = dVar4;
      dStack_38 = secplane_t::ZatPoint(&psStack_18->ceilingplane,local_50);
      dStack_38 = (double)pvVar1 - dStack_38;
    }
  }
  if (ceilingdist_local <= dStack_38) {
    this->m_CeilingSpeed = floordist_local;
    this->m_FloorSpeed = (floordist_local * ceilingdist_local) / dStack_38;
  }
  else {
    this->m_FloorSpeed = floordist_local;
    this->m_CeilingSpeed = (floordist_local * dStack_38) / ceilingdist_local;
  }
  if ((((this->super_DMover).super_DSectorEffect.m_Sector)->Flags & 0x40) == 0) {
    if (psStack_18->seqType < 0) {
      bVar2 = FName::operator!=(&(psStack_18->SeqName).super_FName,NAME_None);
      sec = psStack_18;
      if (bVar2) {
        FName::FName(local_60,&(psStack_18->SeqName).super_FName);
        SN_StartSequence(sec,1,local_60,0);
      }
      else {
        SN_StartSequence(psStack_18,1,"Floor",0);
      }
    }
    else {
      SN_StartSequence(psStack_18,1,(int)psStack_18->seqType,SEQ_PLATFORM,0,false);
    }
  }
  return;
}

Assistant:

DPillar::DPillar (sector_t *sector, EPillar type, double speed,
				  double floordist, double ceilingdist, int crush, bool hexencrush)
	: DMover (sector)
{
	double newheight;
	vertex_t *spot;

	sector->floordata = sector->ceilingdata = this;
	m_Interp_Floor = sector->SetInterpolation(sector_t::FloorMove, true);
	m_Interp_Ceiling = sector->SetInterpolation(sector_t::CeilingMove, true);

	m_Type = type;
	m_Crush = crush;
	m_Hexencrush = hexencrush;

	if (type == pillarBuild)
	{
		// If the pillar height is 0, have the floor and ceiling meet halfway
		if (floordist == 0)
		{
			newheight = (sector->CenterFloor () + sector->CenterCeiling ()) / 2;
			m_FloorTarget = sector->floorplane.PointToDist (sector->centerspot, newheight);
			m_CeilingTarget = sector->ceilingplane.PointToDist (sector->centerspot, newheight);
			floordist = newheight - sector->CenterFloor ();
		}
		else
		{
			newheight = sector->CenterFloor () + floordist;
			m_FloorTarget = sector->floorplane.PointToDist (sector->centerspot, newheight);
			m_CeilingTarget = sector->ceilingplane.PointToDist (sector->centerspot, newheight);
		}
		ceilingdist = sector->CenterCeiling () - newheight;
	}
	else
	{
		// If one of the heights is 0, figure it out based on the
		// surrounding sectors
		if (floordist == 0)
		{
			newheight = sector->FindLowestFloorSurrounding (&spot);
			m_FloorTarget = sector->floorplane.PointToDist (spot, newheight);
			floordist = sector->floorplane.ZatPoint (spot) - newheight;
		}
		else
		{
			newheight = sector->CenterFloor() - floordist;
			m_FloorTarget = sector->floorplane.PointToDist (sector->centerspot, newheight);
		}
		if (ceilingdist == 0)
		{
			newheight = sector->FindHighestCeilingSurrounding (&spot);
			m_CeilingTarget = sector->ceilingplane.PointToDist (spot, newheight);
			ceilingdist = newheight - sector->ceilingplane.ZatPoint (spot);
		}
		else
		{
			newheight = sector->CenterCeiling() + ceilingdist;
			m_CeilingTarget = sector->ceilingplane.PointToDist (sector->centerspot, newheight);
		}
	}

	// The speed parameter applies to whichever part of the pillar
	// travels the farthest. The other part's speed is then set so
	// that it arrives at its destination at the same time.
	if (floordist > ceilingdist)
	{
		m_FloorSpeed = speed;
		m_CeilingSpeed = speed * ceilingdist / floordist;
	}
	else
	{
		m_CeilingSpeed = speed;
		m_FloorSpeed = speed * floordist / ceilingdist;
	}

	if (!(m_Sector->Flags & SECF_SILENTMOVE))
	{
		if (sector->seqType >= 0)
		{
			SN_StartSequence(sector, CHAN_FLOOR, sector->seqType, SEQ_PLATFORM, 0);
		}
		else if (sector->SeqName != NAME_None)
		{
			SN_StartSequence(sector, CHAN_FLOOR, sector->SeqName, 0);
		}
		else
		{
			SN_StartSequence(sector, CHAN_FLOOR, "Floor", 0);
		}
	}
}